

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerlinNoise.cpp
# Opt level: O0

void __thiscall PerlinNoise::PerlinNoise(PerlinNoise *this)

{
  result_type_conflict1 rVar1;
  iterator iVar2;
  iterator iVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2760;
  const_iterator local_2758;
  int *local_2750;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2748;
  undefined1 local_2740 [8];
  mt19937 engine;
  random_device rd;
  PerlinNoise *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector(&this->p);
  std::vector<int,_std::allocator<int>_>::resize(&this->p,0x100);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin(&this->p);
  iVar3 = std::vector<int,_std::allocator<int>_>::end(&this->p);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current,0);
  std::random_device::random_device((random_device *)&engine._M_p);
  rVar1 = std::random_device::operator()((random_device *)&engine._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2740,(ulong)rVar1);
  local_2748._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->p);
  local_2750 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->p);
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (local_2748,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_2750,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2740);
  local_2760._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&this->p);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_2758,
             &local_2760);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin(&this->p);
  iVar3 = std::vector<int,_std::allocator<int>_>::end(&this->p);
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)this,local_2758,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current);
  std::random_device::~random_device((random_device *)&engine._M_p);
  return;
}

Assistant:

PerlinNoise::PerlinNoise() {
    p.resize(256);

    // Fill p with values from 0 to 255
    std::iota(p.begin(), p.end(), 0);

    // Initialize a random engine
    std::random_device rd;
    std::mt19937 engine(rd());

    // Suffle  using the above random engine
    std::shuffle(p.begin(), p.end(), engine);

    // Duplicate the permutation vector
    p.insert(p.end(), p.begin(), p.end());
}